

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secretWord.cpp
# Opt level: O2

bool userWon(string *verify,char (*guesses) [10])

{
  char *pcVar1;
  int iVar2;
  int i;
  long lVar3;
  int j;
  ulong uVar4;
  
  iVar2 = 0;
  for (lVar3 = 0; lVar3 != 10; lVar3 = lVar3 + 1) {
    for (uVar4 = 0; uVar4 < verify->_M_string_length; uVar4 = uVar4 + 1) {
      pcVar1 = (char *)std::__cxx11::string::at((ulong)verify);
      iVar2 = iVar2 + (uint)(*pcVar1 == (*guesses)[lVar3]);
    }
  }
  return verify->_M_string_length == (long)iVar2;
}

Assistant:

bool userWon(string verify, char (&guesses)[GUESS_NUM])
{
    //function to see if our user has won the game yet
    //returns true or false
    //this checks the number of correct guessed characters verses the number of unique letters

    int correctGuesses = 0;

    for(int i = 0; i < GUESS_NUM; i++)
    {
        for(int j = 0; j < verify.length(); j++)
        {
            if(verify.at(j) == guesses[i])
            {
                correctGuesses++;
            }
        }
    }

    if(correctGuesses == verify.length())
    {
        return true;
    }
    else
    {
        return false;
    }
}